

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O1

size_t __thiscall htmlcxx2::HTML::Node::parseAttributes(Node *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  string val;
  string key;
  size_t local_b0;
  string local_a0;
  string local_80;
  string local_60;
  byte *local_40;
  byte *local_38;
  
  if (this->kind_ == NODE_TAG) {
    if (this->attributesParsed_ == true) {
      return (long)(this->attributeKeys_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->attributeKeys_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    this->attributesParsed_ = true;
    pcVar4 = strchr((this->text_)._M_dataplus._M_p,0x3c);
    if (pcVar4 != (char *)0x0) {
      pbVar9 = (byte *)(pcVar4 + -2);
      do {
        bVar2 = pbVar9[3];
        iVar3 = isspace((uint)bVar2);
        pbVar9 = pbVar9 + 1;
      } while (iVar3 != 0);
      iVar3 = isalpha((uint)bVar2);
      if (iVar3 != 0) {
        do {
          bVar2 = pbVar9[2];
          iVar3 = isspace((uint)bVar2);
          pbVar9 = pbVar9 + 1;
          if (bVar2 == 0x3e) break;
        } while (iVar3 == 0);
        do {
          pbVar8 = pbVar9 + 1;
          pbVar9 = pbVar9 + 1;
          iVar3 = isspace((uint)*pbVar8);
        } while (iVar3 != 0);
        do {
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          if ((*pbVar9 == 0) || (*pbVar9 == 0x3e)) {
            return (long)(this->attributeKeys_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->attributeKeys_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          }
          local_80._M_string_length = 0;
          local_80.field_2._M_local_buf[0] = '\0';
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          local_a0._M_string_length = 0;
          local_a0.field_2._M_local_buf[0] = '\0';
          bVar2 = *pbVar9;
          while (bVar2 != 0) {
            iVar3 = isalnum((uint)bVar2);
            if ((iVar3 != 0) || (iVar3 = isspace((uint)bVar2), iVar3 != 0)) break;
            pbVar8 = pbVar9 + 1;
            pbVar9 = pbVar9 + 1;
            bVar2 = *pbVar8;
          }
          pbVar9 = pbVar9 + -1;
          do {
            pbVar8 = pbVar9;
            iVar3 = isspace((uint)pbVar8[1]);
            pbVar9 = pbVar8 + 1;
          } while (iVar3 != 0);
          do {
            do {
              local_40 = pbVar9;
              pbVar9 = pbVar8 + 1;
              bVar2 = pbVar8[1];
              local_38 = pbVar8;
              iVar3 = isalnum((uint)bVar2);
              pbVar8 = pbVar9;
              pbVar9 = local_40;
            } while (bVar2 == 0x2d);
          } while (iVar3 != 0);
          std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_40);
          pbVar9 = local_38;
          do {
            bVar2 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
            iVar3 = isspace((uint)bVar2);
          } while (iVar3 != 0);
          if (bVar2 == 0x3d) {
            do {
              pbVar8 = pbVar9;
              bVar2 = pbVar8[1];
              pbVar9 = pbVar8 + 1;
              iVar3 = isspace((uint)bVar2);
            } while (iVar3 != 0);
            if ((bVar2 == 0x22) || (bVar2 == 0x27)) {
              pbVar8 = pbVar8 + 2;
              pbVar5 = (byte *)strchr((char *)pbVar8,(int)(char)bVar2);
              if (pbVar5 == (byte *)0x0) {
                pbVar6 = (byte *)strchr((char *)pbVar8,0x20);
                pbVar7 = (byte *)strchr((char *)pbVar8,0x3e);
                pbVar5 = pbVar7;
                if (pbVar6 < pbVar7) {
                  pbVar5 = pbVar6;
                }
                if (pbVar6 == (byte *)0x0) {
                  pbVar5 = pbVar7;
                }
                if (pbVar5 != (byte *)0x0) goto LAB_00159ef2;
                bVar1 = false;
                local_b0 = (long)(this->attributeKeys_).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->attributeKeys_).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5;
              }
              else {
LAB_00159ef2:
                do {
                  pbVar6 = pbVar8;
                  iVar3 = isspace((uint)*pbVar6);
                  pbVar9 = pbVar5;
                  if (pbVar5 <= pbVar6) break;
                  pbVar8 = pbVar6 + 1;
                } while (iVar3 != 0);
                do {
                  pbVar9 = pbVar9 + -1;
                  iVar3 = isspace((uint)*pbVar9);
                  if (pbVar9 < pbVar6) break;
                } while (iVar3 != 0);
                std::__cxx11::string::replace
                          ((ulong)&local_a0,0,(char *)local_a0._M_string_length,(ulong)pbVar6);
                pbVar9 = pbVar5 + 1;
                bVar1 = true;
              }
              pbVar8 = pbVar9;
              if (!bVar1) {
                bVar1 = false;
                goto LAB_00159f6c;
              }
            }
            else {
              bVar2 = *pbVar9;
              pbVar8 = pbVar9;
              while (((bVar2 != 0 && (iVar3 = isspace((uint)bVar2), bVar2 != 0x3e)) && (iVar3 == 0))
                    ) {
                bVar2 = pbVar8[1];
                pbVar8 = pbVar8 + 1;
              }
              std::__cxx11::string::replace
                        ((ulong)&local_a0,0,(char *)local_a0._M_string_length,(ulong)pbVar9);
            }
            bVar1 = true;
            addAttribute(this,&local_80,&local_a0);
            pbVar9 = pbVar8;
          }
          else {
            bVar1 = true;
            if (local_80._M_string_length != 0) {
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
              addAttribute(this,&local_80,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
LAB_00159f6c:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,
                            CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                     local_a0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,
                            CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                     local_80.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar1) {
            return local_b0;
          }
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

bool isTag() const                     { return kind_ == NODE_TAG; }